

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

__m256i * paeth_32x1_pred(__m256i *left,__m256i *top0,__m256i *top1,__m256i *topleft)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *palVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar4 [32];
  __m256i x1;
  __m256i x0;
  __m256i p1;
  __m256i p0;
  undefined1 local_100 [32];
  __m256i *in_stack_ffffffffffffff60;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *in_stack_ffffffffffffff70;
  
  paeth_pred(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_100._8_8_ = in_XMM0_Qb;
  local_100._0_8_ = in_XMM0_Qa;
  local_100._16_8_ = in_YMM0_H;
  local_100._24_8_ = in_register_00001218;
  auVar1 = vpermq_avx2(local_100,0xe);
  auVar2._16_8_ = in_YMM0_H;
  auVar2._0_16_ = local_100._0_16_;
  auVar2._24_8_ = in_register_00001218;
  auVar1 = vpackuswb_avx2(auVar2,auVar1);
  auVar4 = auVar1;
  palVar3 = paeth_pred(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                      );
  auVar2 = vpermq_avx2(auVar4,0xe);
  auVar2 = vpackuswb_avx2(auVar4,auVar2);
  vperm2i128_avx2(auVar1,auVar2,0x20);
  return palVar3;
}

Assistant:

static inline __m256i paeth_32x1_pred(const __m256i *left, const __m256i *top0,
                                      const __m256i *top1,
                                      const __m256i *topleft) {
  __m256i p0 = paeth_pred(left, top0, topleft);
  __m256i p1 = _mm256_permute4x64_epi64(p0, 0xe);
  const __m256i x0 = _mm256_packus_epi16(p0, p1);

  p0 = paeth_pred(left, top1, topleft);
  p1 = _mm256_permute4x64_epi64(p0, 0xe);
  const __m256i x1 = _mm256_packus_epi16(p0, p1);

  return _mm256_permute2x128_si256(x0, x1, 0x20);
}